

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O0

ParseDescriptorResponseStruct *
cfd::js::api::ElementsAddressStructApi::ParseDescriptor
          (ParseDescriptorResponseStruct *__return_storage_ptr__,
          ParseDescriptorRequestStruct *request)

{
  ParseDescriptorRequestStruct *this;
  string *in_R8;
  allocator local_201;
  function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
  local_200;
  undefined1 local_1e0 [454];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  ParseDescriptorRequestStruct *pPStack_18;
  anon_class_1_0_00000001 call_func;
  ParseDescriptorRequestStruct *request_local;
  ParseDescriptorResponseStruct *result;
  
  local_1a = 0;
  pPStack_18 = request;
  ParseDescriptorResponseStruct::ParseDescriptorResponseStruct(__return_storage_ptr__);
  this = pPStack_18;
  std::
  function<cfd::js::api::ParseDescriptorResponseStruct(cfd::js::api::ParseDescriptorRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsAddressStructApi::ParseDescriptor(cfd::js::api::ParseDescriptorRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::ParseDescriptorResponseStruct(cfd::js::api::ParseDescriptorRequestStruct_const&)>
              *)local_1e0,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"ParseDescriptor",&local_201);
  ExecuteStructApi<cfd::js::api::ParseDescriptorRequestStruct,cfd::js::api::ParseDescriptorResponseStruct>
            ((ParseDescriptorResponseStruct *)(local_1e0 + 0x20),(api *)this,
             (ParseDescriptorRequestStruct *)local_1e0,&local_200,in_R8);
  ParseDescriptorResponseStruct::operator=
            (__return_storage_ptr__,(ParseDescriptorResponseStruct *)(local_1e0 + 0x20));
  ParseDescriptorResponseStruct::~ParseDescriptorResponseStruct
            ((ParseDescriptorResponseStruct *)(local_1e0 + 0x20));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::
  function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
  ::~function((function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
               *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

ParseDescriptorResponseStruct ElementsAddressStructApi::ParseDescriptor(
    const ParseDescriptorRequestStruct& request) {
  auto call_func = [](const ParseDescriptorRequestStruct& request)
      -> ParseDescriptorResponseStruct {  // NOLINT
    NetType net_type = ConvertElementsNetType(request.network);
    ElementsAddressFactory api(net_type);
    return AddressApiBase::ParseDescriptor(request, &api);
  };

  ParseDescriptorResponseStruct result;
  result = ExecuteStructApi<
      ParseDescriptorRequestStruct, ParseDescriptorResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}